

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::handleLoopAttributes
          (TParseContext *this,TAttributes *attributes,TIntermNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar3;
  reference ppTVar4;
  undefined4 extraout_var_01;
  pointer pTVar5;
  undefined4 extraout_var_02;
  uint local_c8;
  int local_c4;
  uint uiValue;
  int value;
  anon_class_16_2_3fe397bd spirv14;
  anon_class_24_3_97e273f6 positiveUnsignedArgument;
  anon_class_24_3_97e273f6 unsignedArgument;
  anon_class_24_3_97e273f6 positiveSignedArgument;
  anon_class_24_3_97e273f6 noArgument;
  _Self local_48;
  const_iterator it_1;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_38;
  iterator it;
  TIntermAggregate *agg;
  TIntermLoop *loop;
  TIntermNode *node_local;
  TAttributes *attributes_local;
  TParseContext *this_local;
  
  loop = (TIntermLoop *)node;
  node_local = (TIntermNode *)attributes;
  attributes_local = (TAttributes *)this;
  iVar2 = (*node->_vptr_TIntermNode[0xe])();
  agg = (TIntermAggregate *)CONCAT44(extraout_var,iVar2);
  if (agg == (TIntermAggregate *)0x0) {
    iVar2 = (*(loop->super_TIntermNode)._vptr_TIntermNode[6])();
    it._M_current = (TIntermNode **)CONCAT44(extraout_var_00,iVar2);
    if (it._M_current == (TIntermNode **)0x0) {
      return;
    }
    pvVar3 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             (**(code **)&(*it._M_current)[0xc].loc.string)();
    local_38._M_current =
         (TIntermNode **)
         std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(pvVar3);
    while( true ) {
      pvVar3 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (**(code **)&(*it._M_current)[0xc].loc.string)();
      it_1._M_node = (_List_node_base *)
                     std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                               (pvVar3);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                          *)&it_1);
      if (!bVar1) break;
      ppTVar4 = __gnu_cxx::
                __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&local_38);
      iVar2 = (*(*ppTVar4)->_vptr_TIntermNode[0xe])();
      agg = (TIntermAggregate *)CONCAT44(extraout_var_01,iVar2);
      if (agg != (TIntermAggregate *)0x0) break;
      __gnu_cxx::
      __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
      ::operator++(&local_38);
    }
    if (agg == (TIntermAggregate *)0x0) {
      return;
    }
  }
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::begin
                 ((list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                   *)node_local);
  while( true ) {
    noArgument.node =
         (TIntermNode **)
         std::__cxx11::
         list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::end
                   ((list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                     *)node_local);
    bVar1 = std::operator!=(&local_48,(_Self *)&noArgument.node);
    if (!bVar1) break;
    spirv14.node = (TIntermNode **)&local_48;
    spirv14.this = (TParseContext *)&loop;
    local_c4 = 0;
    local_c8 = 0;
    _uiValue = this;
    positiveUnsignedArgument.it = (const_iterator *)this;
    positiveUnsignedArgument.this = spirv14.this;
    positiveUnsignedArgument.node = spirv14.node;
    unsignedArgument.it = (const_iterator *)this;
    unsignedArgument.this = spirv14.this;
    unsignedArgument.node = spirv14.node;
    positiveSignedArgument.it = (const_iterator *)this;
    positiveSignedArgument.this = spirv14.this;
    positiveSignedArgument.node = spirv14.node;
    noArgument.it = (const_iterator *)this;
    noArgument.this = spirv14.this;
    pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->
                       ((_List_const_iterator<glslang::TAttributeArgs> *)spirv14.node);
    switch(pTVar5->name) {
    case EatUnroll:
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&positiveSignedArgument.node,"unroll");
      if (bVar1) {
        TIntermLoop::setUnroll((TIntermLoop *)agg);
      }
      break;
    case EatLoop:
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&positiveSignedArgument.node,"dont_unroll");
      if (bVar1) {
        TIntermLoop::setDontUnroll((TIntermLoop *)agg);
      }
      break;
    default:
      iVar2 = (**(loop->super_TIntermNode)._vptr_TIntermNode)();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,CONCAT44(extraout_var_02,iVar2),"attribute does not apply to a loop","");
      break;
    case EatDependencyInfinite:
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&positiveSignedArgument.node,
                         "dependency_infinite");
      if (bVar1) {
        TIntermLoop::setLoopDependency((TIntermLoop *)agg,-1);
      }
      break;
    case EatDependencyLength:
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&unsignedArgument.node,"dependency_length",
                         &local_c4);
      if (bVar1) {
        TIntermLoop::setLoopDependency((TIntermLoop *)agg,local_c4);
      }
      break;
    case EatMinIterations:
      handleLoopAttributes::anon_class_16_2_3fe397bd::operator()
                ((anon_class_16_2_3fe397bd *)&uiValue,"min_iterations");
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&positiveUnsignedArgument.node,"min_iterations"
                         ,&local_c8);
      if (bVar1) {
        TIntermLoop::setMinIterations((TIntermLoop *)agg,local_c8);
      }
      break;
    case EatMaxIterations:
      handleLoopAttributes::anon_class_16_2_3fe397bd::operator()
                ((anon_class_16_2_3fe397bd *)&uiValue,"max_iterations");
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&positiveUnsignedArgument.node,"max_iterations"
                         ,&local_c8);
      if (bVar1) {
        TIntermLoop::setMaxIterations((TIntermLoop *)agg,local_c8);
      }
      break;
    case EatIterationMultiple:
      handleLoopAttributes::anon_class_16_2_3fe397bd::operator()
                ((anon_class_16_2_3fe397bd *)&uiValue,"iteration_multiple");
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&spirv14.node,"iteration_multiple",&local_c8);
      if (bVar1) {
        TIntermLoop::setIterationMultiple((TIntermLoop *)agg,local_c8);
      }
      break;
    case EatPeelCount:
      handleLoopAttributes::anon_class_16_2_3fe397bd::operator()
                ((anon_class_16_2_3fe397bd *)&uiValue,"peel_count");
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&positiveUnsignedArgument.node,"peel_count",
                         &local_c8);
      if (bVar1) {
        TIntermLoop::setPeelCount((TIntermLoop *)agg,local_c8);
      }
      break;
    case EatPartialCount:
      handleLoopAttributes::anon_class_16_2_3fe397bd::operator()
                ((anon_class_16_2_3fe397bd *)&uiValue,"partial_count");
      bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                        ((anon_class_24_3_97e273f6 *)&positiveUnsignedArgument.node,"partial_count",
                         &local_c8);
      if (bVar1) {
        TIntermLoop::setPartialCount((TIntermLoop *)agg,local_c8);
      }
    }
    std::_List_const_iterator<glslang::TAttributeArgs>::operator++(&local_48);
  }
  return;
}

Assistant:

void TParseContext::handleLoopAttributes(const TAttributes& attributes, TIntermNode* node)
{
    TIntermLoop* loop = node->getAsLoopNode();
    if (loop == nullptr) {
        // the actual loop might be part of a sequence
        TIntermAggregate* agg = node->getAsAggregate();
        if (agg == nullptr)
            return;
        for (auto it = agg->getSequence().begin(); it != agg->getSequence().end(); ++it) {
            loop = (*it)->getAsLoopNode();
            if (loop != nullptr)
                break;
        }
        if (loop == nullptr)
            return;
    }

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {

        const auto noArgument = [&](const char* feature) {
            if (it->size() > 0) {
                warn(node->getLoc(), "expected no arguments", feature, "");
                return false;
            }
            return true;
        };

        const auto positiveSignedArgument = [&](const char* feature, int& value) {
            if (it->size() == 1 && it->getInt(value)) {
                if (value <= 0) {
                    error(node->getLoc(), "must be positive", feature, "");
                    return false;
                }
            } else {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            return true;
        };

        const auto unsignedArgument = [&](const char* feature, unsigned int& uiValue) {
            int value;
            if (!(it->size() == 1 && it->getInt(value))) {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            uiValue = (unsigned int)value;
            return true;
        };

        const auto positiveUnsignedArgument = [&](const char* feature, unsigned int& uiValue) {
            int value;
            if (it->size() == 1 && it->getInt(value)) {
                if (value == 0) {
                    error(node->getLoc(), "must be greater than or equal to 1", feature, "");
                    return false;
                }
            } else {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            uiValue = (unsigned int)value;
            return true;
        };

        const auto spirv14 = [&](const char* feature) {
            if (spvVersion.spv > 0 && spvVersion.spv < EShTargetSpv_1_4)
                warn(node->getLoc(), "attribute requires a SPIR-V 1.4 target-env", feature, "");
        };

        int value = 0;
        unsigned uiValue = 0;
        switch (it->name) {
        case EatUnroll:
            if (noArgument("unroll"))
                loop->setUnroll();
            break;
        case EatLoop:
            if (noArgument("dont_unroll"))
                loop->setDontUnroll();
            break;
        case EatDependencyInfinite:
            if (noArgument("dependency_infinite"))
                loop->setLoopDependency(TIntermLoop::dependencyInfinite);
            break;
        case EatDependencyLength:
            if (positiveSignedArgument("dependency_length", value))
                loop->setLoopDependency(value);
            break;
        case EatMinIterations:
            spirv14("min_iterations");
            if (unsignedArgument("min_iterations", uiValue))
                loop->setMinIterations(uiValue);
            break;
        case EatMaxIterations:
            spirv14("max_iterations");
            if (unsignedArgument("max_iterations", uiValue))
                loop->setMaxIterations(uiValue);
            break;
        case EatIterationMultiple:
            spirv14("iteration_multiple");
            if (positiveUnsignedArgument("iteration_multiple", uiValue))
                loop->setIterationMultiple(uiValue);
            break;
        case EatPeelCount:
            spirv14("peel_count");
            if (unsignedArgument("peel_count", uiValue))
                loop->setPeelCount(uiValue);
            break;
        case EatPartialCount:
            spirv14("partial_count");
            if (unsignedArgument("partial_count", uiValue))
                loop->setPartialCount(uiValue);
            break;
        default:
            warn(node->getLoc(), "attribute does not apply to a loop", "", "");
            break;
        }
    }
}